

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_hierarchy.cc
# Opt level: O3

sub_idx_t lf::refinement::MeshHierarchy::LongestEdge(Entity *T)

{
  int iVar1;
  size_type sVar2;
  undefined4 extraout_var;
  Scalar *pSVar3;
  long *plVar4;
  Scalar *pSVar5;
  runtime_error *this;
  ulong uVar6;
  sub_idx_t sVar7;
  ulong uVar8;
  double dVar9;
  MatrixXd mp_refc;
  string local_228;
  double local_208;
  double local_200;
  string local_1f8;
  string local_1d8;
  undefined1 local_1b8 [16];
  Index local_1a8;
  
  iVar1 = (**T->_vptr_Entity)();
  if (iVar1 == 0) {
    iVar1 = (*T->_vptr_Entity[4])(T);
    local_1b8[0] = (char)iVar1;
    sVar2 = base::RefEl::NumSubEntities((RefEl *)local_1b8,1);
    iVar1 = (*T->_vptr_Entity[1])(T,1);
    local_1b8._0_8_ = (double *)0x0;
    local_1b8._8_8_ = 0;
    local_1a8 = 0;
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::resize
              ((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_1b8,1,1);
    sVar7 = 0;
    pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)local_1b8,0,
                        0);
    *pSVar3 = 0.5;
    if (sVar2 != 0) {
      dVar9 = 0.0;
      uVar6 = 0;
      uVar8 = 0;
      do {
        local_200 = dVar9;
        plVar4 = (long *)(**(code **)(**(long **)(CONCAT44(extraout_var,iVar1) + uVar6 * 8) + 0x18))
                                   ();
        (**(code **)(*plVar4 + 0x30))(&local_228,plVar4,local_1b8);
        pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                           ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&local_228
                            ,0);
        local_208 = *pSVar5;
        free(local_228._M_dataplus._M_p);
        if (local_200 < local_208) {
          uVar8 = uVar6 & 0xffffffff;
        }
        sVar7 = (sub_idx_t)uVar8;
        dVar9 = local_208;
        if (local_208 <= local_200) {
          dVar9 = local_200;
        }
        uVar6 = uVar6 + 1;
      } while (sVar2 != uVar6);
    }
    free((void *)local_1b8._0_8_);
    return sVar7;
  }
  std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_1a8,"Entity must be a call",0x15);
  local_228._M_dataplus._M_p = (pointer)&local_228.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_228,"T.Codim() == 0","");
  local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1f8,
             "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/refinement/mesh_hierarchy.cc"
             ,"");
  std::__cxx11::stringbuf::str();
  base::AssertionFailed(&local_228,&local_1f8,0x730,&local_1d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
    operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
    operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_228._M_dataplus._M_p != &local_228.field_2) {
    operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this,"this code should not be reached");
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

sub_idx_t MeshHierarchy::LongestEdge(const lf::mesh::Entity &T) {
  LF_VERIFY_MSG(T.Codim() == 0, "Entity must be a call");
  // Obtain iterator over the edges
  const size_type num_edges = T.RefEl().NumSubEntities(1);
  auto sub_edges = T.SubEntities(1);
  double max_len = 0.0;
  sub_idx_t idx_longest_edge = 0;
  Eigen::MatrixXd mp_refc(1, 1);
  mp_refc(0, 0) = 0.5;
  for (int k = 0; k < num_edges; k++) {
    // Approximate length by "1-point quadrature"
    const double approx_length =
        (sub_edges[k]->Geometry()->IntegrationElement(mp_refc))[0];
    if (max_len < approx_length) {
      idx_longest_edge = k;
      max_len = approx_length;
    }
  }
  return idx_longest_edge;
}